

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

MDD lddmc_serialize_get_reversed(size_t value)

{
  avl_node_t *paVar1;
  
  paVar1 = lddmc_ser_reversed_set;
  if (1 < value) {
    while( true ) {
      if (paVar1 == (avl_node_t *)0x0) {
        __assert_fail("ss != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                      ,0x9d6,"MDD lddmc_serialize_get_reversed(size_t)");
      }
      if (paVar1[1].right == (avl_node *)value) break;
      paVar1 = *(avl_node_t **)(paVar1->pad + (ulong)(paVar1[1].right <= value) * 8 + -0x14);
    }
    value = (size_t)paVar1[1].left;
  }
  return (MDD)(avl_node *)value;
}

Assistant:

MDD
lddmc_serialize_get_reversed(size_t value)
{
    if ((MDD)value <= lddmc_true) return (MDD)value;
    struct lddmc_ser s, *ss;
    s.assigned = value;
    ss = lddmc_ser_reversed_search(lddmc_ser_reversed_set, &s);
    assert(ss != NULL);
    return ss->mdd;
}